

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensus.hpp
# Opt level: O0

void __thiscall
opengv::sac::SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::
~SampleConsensus(SampleConsensus<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>
                 *this)

{
  undefined8 *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  *in_RDI = &PTR__SampleConsensus_01483a58;
  std::shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem>::~shared_ptr
            ((shared_ptr<opengv::sac_problems::relative_pose::CentralRelativePoseSacProblem> *)
             0xbb591d);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  return;
}

Assistant:

opengv::sac::SampleConsensus<P>::~SampleConsensus(){}